

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qpromiseresolver.h
# Opt level: O0

void __thiscall
QtPromisePrivate::PromiseResolver<(anonymous_namespace)::Enum1>::
reject<QtPromisePrivate::PromiseError_const&>
          (PromiseResolver<(anonymous_namespace)::Enum1> *this,PromiseError *error)

{
  QPromise<(anonymous_namespace)::Enum1> *pQVar1;
  Data *pDVar2;
  PromiseData<(anonymous_namespace)::Enum1> *pPVar3;
  QPromise<(anonymous_namespace)::Enum1> *promise;
  PromiseError *error_local;
  PromiseResolver<(anonymous_namespace)::Enum1> *this_local;
  
  pDVar2 = QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<(anonymous_namespace)::Enum1>::Data>
           ::operator->(&this->m_d);
  pQVar1 = pDVar2->promise;
  if (pQVar1 != (QPromise<(anonymous_namespace)::Enum1> *)0x0) {
    pPVar3 = QExplicitlySharedDataPointer<QtPromisePrivate::PromiseData<(anonymous_namespace)::Enum1>_>
             ::operator->(&(pQVar1->super_QPromiseBase<(anonymous_namespace)::Enum1>).m_d);
    PromiseDataBase<(anonymous_namespace)::Enum1,void((anonymous_namespace)::Enum1_const&)>::
    reject<QtPromisePrivate::PromiseError_const&>
              ((PromiseDataBase<(anonymous_namespace)::Enum1,void((anonymous_namespace)::Enum1_const&)>
                *)pPVar3,error);
    pPVar3 = QExplicitlySharedDataPointer<QtPromisePrivate::PromiseData<(anonymous_namespace)::Enum1>_>
             ::operator->(&(pQVar1->super_QPromiseBase<(anonymous_namespace)::Enum1>).m_d);
    PromiseDataBase<(anonymous_namespace)::Enum1,_void_(const_(anonymous_namespace)::Enum1_&)>::
    dispatch(&pPVar3->
              super_PromiseDataBase<(anonymous_namespace)::Enum1,_void_(const_(anonymous_namespace)::Enum1_&)>
            );
    release(this);
  }
  return;
}

Assistant:

void reject(E&& error)
    {
        auto promise = m_d->promise;
        if (promise) {
            Q_ASSERT(promise->isPending());
            promise->m_d->reject(std::forward<E>(error));
            promise->m_d->dispatch();
            release();
        }
    }